

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O0

void sys_register_loader(loader_t loader)

{
  loader_queue *plVar1;
  loader_queue_t *local_18;
  loader_queue_t *q;
  loader_t loader_local;
  
  local_18 = &loaders;
  while( true ) {
    if (local_18->loader == loader) {
      return;
    }
    if (local_18->next == (loader_queue *)0x0) break;
    local_18 = local_18->next;
  }
  plVar1 = (loader_queue *)getbytes(0x10);
  local_18->next = plVar1;
  local_18->next->loader = loader;
  local_18->next->next = (loader_queue *)0x0;
  return;
}

Assistant:

void sys_register_loader(loader_t loader)
{
    loader_queue_t *q = &loaders;
    while (1)
    {
        if (q->loader == loader)    /* already loaded - nothing to do */
            return;
        else if (q->next)
            q = q->next;
        else
        {
            q->next = (loader_queue_t *)getbytes(sizeof(loader_queue_t));
            q->next->loader = loader;
            q->next->next = NULL;
            break;
        }
    }
}